

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_bitonic_sort_12(int **dst)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  int *_sort_swap_temp_22;
  int *_sort_swap_temp_21;
  int *_sort_swap_temp_20;
  int *_sort_swap_temp_19;
  int *_sort_swap_temp_18;
  int *_sort_swap_temp_17;
  int *_sort_swap_temp_16;
  int *_sort_swap_temp_15;
  int *_sort_swap_temp_14;
  int *_sort_swap_temp_13;
  int *_sort_swap_temp_12;
  int *_sort_swap_temp_11;
  int *_sort_swap_temp_10;
  int *_sort_swap_temp_9;
  int *_sort_swap_temp_8;
  int *_sort_swap_temp_7;
  int *_sort_swap_temp_6;
  int *_sort_swap_temp_5;
  int *_sort_swap_temp_4;
  int *_sort_swap_temp_3;
  int *_sort_swap_temp_2;
  int *_sort_swap_temp_1;
  int *_sort_swap_temp;
  int *_sort_swap_temp_38;
  int *_sort_swap_temp_37;
  int *_sort_swap_temp_36;
  int *_sort_swap_temp_35;
  int *_sort_swap_temp_34;
  int *_sort_swap_temp_33;
  int *_sort_swap_temp_32;
  int *_sort_swap_temp_31;
  int *_sort_swap_temp_30;
  int *_sort_swap_temp_29;
  int *_sort_swap_temp_28;
  int *_sort_swap_temp_27;
  int *_sort_swap_temp_26;
  int *_sort_swap_temp_25;
  int *_sort_swap_temp_24;
  int *_sort_swap_temp_23;
  
  if (0 < *(int *)*in_RDI - *(int *)in_RDI[1]) {
    uVar1 = *in_RDI;
    *in_RDI = in_RDI[1];
    in_RDI[1] = uVar1;
  }
  if (0 < *(int *)in_RDI[2] - *(int *)in_RDI[3]) {
    uVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[3];
    in_RDI[3] = uVar1;
  }
  if (0 < *(int *)in_RDI[4] - *(int *)in_RDI[5]) {
    uVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[5];
    in_RDI[5] = uVar1;
  }
  if (0 < *(int *)in_RDI[6] - *(int *)in_RDI[7]) {
    uVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[7];
    in_RDI[7] = uVar1;
  }
  if (0 < *(int *)in_RDI[8] - *(int *)in_RDI[9]) {
    uVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[9];
    in_RDI[9] = uVar1;
  }
  if (0 < *(int *)in_RDI[10] - *(int *)in_RDI[0xb]) {
    uVar1 = in_RDI[10];
    in_RDI[10] = in_RDI[0xb];
    in_RDI[0xb] = uVar1;
  }
  if (0 < *(int *)in_RDI[1] - *(int *)in_RDI[3]) {
    uVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[3];
    in_RDI[3] = uVar1;
  }
  if (0 < *(int *)in_RDI[5] - *(int *)in_RDI[7]) {
    uVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[7];
    in_RDI[7] = uVar1;
  }
  if (0 < *(int *)in_RDI[9] - *(int *)in_RDI[0xb]) {
    uVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[0xb];
    in_RDI[0xb] = uVar1;
  }
  if (0 < *(int *)*in_RDI - *(int *)in_RDI[2]) {
    uVar1 = *in_RDI;
    *in_RDI = in_RDI[2];
    in_RDI[2] = uVar1;
  }
  if (0 < *(int *)in_RDI[4] - *(int *)in_RDI[6]) {
    uVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[6];
    in_RDI[6] = uVar1;
  }
  if (0 < *(int *)in_RDI[8] - *(int *)in_RDI[10]) {
    uVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[10];
    in_RDI[10] = uVar1;
  }
  if (0 < *(int *)in_RDI[1] - *(int *)in_RDI[2]) {
    uVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[2];
    in_RDI[2] = uVar1;
  }
  if (0 < *(int *)in_RDI[5] - *(int *)in_RDI[6]) {
    uVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[6];
    in_RDI[6] = uVar1;
  }
  if (0 < *(int *)in_RDI[9] - *(int *)in_RDI[10]) {
    uVar1 = in_RDI[9];
    in_RDI[9] = in_RDI[10];
    in_RDI[10] = uVar1;
  }
  if (0 < *(int *)*in_RDI - *(int *)in_RDI[4]) {
    uVar1 = *in_RDI;
    *in_RDI = in_RDI[4];
    in_RDI[4] = uVar1;
  }
  if (0 < *(int *)in_RDI[7] - *(int *)in_RDI[0xb]) {
    uVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[0xb];
    in_RDI[0xb] = uVar1;
  }
  if (0 < *(int *)in_RDI[1] - *(int *)in_RDI[5]) {
    uVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[5];
    in_RDI[5] = uVar1;
  }
  if (0 < *(int *)in_RDI[6] - *(int *)in_RDI[10]) {
    uVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[10];
    in_RDI[10] = uVar1;
  }
  if (0 < *(int *)in_RDI[3] - *(int *)in_RDI[7]) {
    uVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[7];
    in_RDI[7] = uVar1;
  }
  if (0 < *(int *)in_RDI[4] - *(int *)in_RDI[8]) {
    uVar1 = in_RDI[4];
    in_RDI[4] = in_RDI[8];
    in_RDI[8] = uVar1;
  }
  if (0 < *(int *)in_RDI[5] - *(int *)in_RDI[9]) {
    uVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[9];
    in_RDI[9] = uVar1;
  }
  if (0 < *(int *)in_RDI[2] - *(int *)in_RDI[6]) {
    uVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[6];
    in_RDI[6] = uVar1;
  }
  if (0 < *(int *)*in_RDI - *(int *)in_RDI[4]) {
    uVar1 = *in_RDI;
    *in_RDI = in_RDI[4];
    in_RDI[4] = uVar1;
  }
  if (0 < *(int *)in_RDI[7] - *(int *)in_RDI[0xb]) {
    uVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[0xb];
    in_RDI[0xb] = uVar1;
  }
  if (0 < *(int *)in_RDI[3] - *(int *)in_RDI[8]) {
    uVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[8];
    in_RDI[8] = uVar1;
  }
  if (0 < *(int *)in_RDI[1] - *(int *)in_RDI[5]) {
    uVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[5];
    in_RDI[5] = uVar1;
  }
  if (0 < *(int *)in_RDI[6] - *(int *)in_RDI[10]) {
    uVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[10];
    in_RDI[10] = uVar1;
  }
  if (0 < *(int *)in_RDI[2] - *(int *)in_RDI[3]) {
    uVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[3];
    in_RDI[3] = uVar1;
  }
  if (0 < *(int *)in_RDI[8] - *(int *)in_RDI[9]) {
    uVar1 = in_RDI[8];
    in_RDI[8] = in_RDI[9];
    in_RDI[9] = uVar1;
  }
  if (0 < *(int *)in_RDI[1] - *(int *)in_RDI[4]) {
    uVar1 = in_RDI[1];
    in_RDI[1] = in_RDI[4];
    in_RDI[4] = uVar1;
  }
  if (0 < *(int *)in_RDI[7] - *(int *)in_RDI[10]) {
    uVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[10];
    in_RDI[10] = uVar1;
  }
  if (0 < *(int *)in_RDI[3] - *(int *)in_RDI[5]) {
    uVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[5];
    in_RDI[5] = uVar1;
  }
  if (0 < *(int *)in_RDI[6] - *(int *)in_RDI[8]) {
    uVar1 = in_RDI[6];
    in_RDI[6] = in_RDI[8];
    in_RDI[8] = uVar1;
  }
  if (0 < *(int *)in_RDI[2] - *(int *)in_RDI[4]) {
    uVar1 = in_RDI[2];
    in_RDI[2] = in_RDI[4];
    in_RDI[4] = uVar1;
  }
  if (0 < *(int *)in_RDI[7] - *(int *)in_RDI[9]) {
    uVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[9];
    in_RDI[9] = uVar1;
  }
  if (0 < *(int *)in_RDI[5] - *(int *)in_RDI[6]) {
    uVar1 = in_RDI[5];
    in_RDI[5] = in_RDI[6];
    in_RDI[6] = uVar1;
  }
  if (0 < *(int *)in_RDI[3] - *(int *)in_RDI[4]) {
    uVar1 = in_RDI[3];
    in_RDI[3] = in_RDI[4];
    in_RDI[4] = uVar1;
  }
  if (0 < *(int *)in_RDI[7] - *(int *)in_RDI[8]) {
    uVar1 = in_RDI[7];
    in_RDI[7] = in_RDI[8];
    in_RDI[8] = uVar1;
  }
  return;
}

Assistant:

static __inline void BITONIC_SORT_12(SORT_TYPE *dst) {
  SORT_CSWAP(dst[0], dst[1]);
  SORT_CSWAP(dst[2], dst[3]);
  SORT_CSWAP(dst[4], dst[5]);
  SORT_CSWAP(dst[6], dst[7]);
  SORT_CSWAP(dst[8], dst[9]);
  SORT_CSWAP(dst[10], dst[11]);
  SORT_CSWAP(dst[1], dst[3]);
  SORT_CSWAP(dst[5], dst[7]);
  SORT_CSWAP(dst[9], dst[11]);
  SORT_CSWAP(dst[0], dst[2]);
  SORT_CSWAP(dst[4], dst[6]);
  SORT_CSWAP(dst[8], dst[10]);
  SORT_CSWAP(dst[1], dst[2]);
  SORT_CSWAP(dst[5], dst[6]);
  SORT_CSWAP(dst[9], dst[10]);
  SORT_CSWAP(dst[0], dst[4]);
  SORT_CSWAP(dst[7], dst[11]);
  SORT_CSWAP(dst[1], dst[5]);
  SORT_CSWAP(dst[6], dst[10]);
  SORT_CSWAP(dst[3], dst[7]);
  SORT_CSWAP(dst[4], dst[8]);
  SORT_CSWAP(dst[5], dst[9]);
  SORT_CSWAP(dst[2], dst[6]);
  SORT_CSWAP(dst[0], dst[4]);
  SORT_CSWAP(dst[7], dst[11]);
  SORT_CSWAP(dst[3], dst[8]);
  SORT_CSWAP(dst[1], dst[5]);
  SORT_CSWAP(dst[6], dst[10]);
  SORT_CSWAP(dst[2], dst[3]);
  SORT_CSWAP(dst[8], dst[9]);
  SORT_CSWAP(dst[1], dst[4]);
  SORT_CSWAP(dst[7], dst[10]);
  SORT_CSWAP(dst[3], dst[5]);
  SORT_CSWAP(dst[6], dst[8]);
  SORT_CSWAP(dst[2], dst[4]);
  SORT_CSWAP(dst[7], dst[9]);
  SORT_CSWAP(dst[5], dst[6]);
  SORT_CSWAP(dst[3], dst[4]);
  SORT_CSWAP(dst[7], dst[8]);
}